

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putRGBcontig16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  uVar1 = img->samplesperpixel;
  while (bVar5 = h != 0, h = h - 1, bVar5) {
    lVar4 = (long)toskew * -4;
    for (lVar3 = 0; w != (uint32_t)lVar3; lVar3 = lVar3 + 1) {
      puVar2 = img->Bitdepth16To8;
      cp[lVar3] = CONCAT12(puVar2[*(ushort *)((long)pp + 4)],
                           CONCAT11(puVar2[*(ushort *)((long)pp + 2)],puVar2[*(ushort *)pp])) |
                  0xff000000;
      lVar4 = lVar4 + -4;
      pp = (uchar *)((long)pp + (ulong)((uint)uVar1 + (uint)uVar1));
    }
    cp = (uint32_t *)((long)cp - lVar4);
    pp = (uchar *)((long)pp + (long)(int)(fromskew * (uint)uVar1) * 2);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig16bittile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t *wp = (uint16_t *)pp;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            *cp++ = PACK(img->Bitdepth16To8[wp[0]], img->Bitdepth16To8[wp[1]],
                         img->Bitdepth16To8[wp[2]]);
            wp += samplesperpixel;
        }
        cp += toskew;
        wp += fromskew;
    }
}